

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *ConversionError,string *msg,ExitCodes exit_code)

{
  string local_68;
  string local_48;
  ExitCodes local_24;
  string *psStack_20;
  ExitCodes exit_code_local;
  string *msg_local;
  string *ConversionError_local;
  ConversionError *this_local;
  
  local_24 = exit_code;
  psStack_20 = msg;
  msg_local = ConversionError;
  ConversionError_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)ConversionError);
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&local_68,local_24);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__ConversionError_0013eb80;
  return;
}

Assistant:

ConversionError(std::string member, std::string name)
        : ConversionError("The value " + member + "is not an allowed value for " + name) {}